

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_string_vector.h
# Opt level: O2

void __thiscall
PlainStringVector<128UL,_4096UL>::add(PlainStringVector<128UL,_4096UL> *this,string *str)

{
  byte *pbVar1;
  size_type sVar2;
  
  sVar2 = (this->items_).size_;
  *(value_type **)((this->items_).data_ + sVar2 * 8 + -8) =
       (this->data_).data_ + (this->data_).size_;
  pbVar1 = (this->items_).data_ + sVar2 * 8;
  pbVar1[0] = 0;
  pbVar1[1] = 0;
  pbVar1[2] = 0;
  pbVar1[3] = 0;
  pbVar1[4] = 0;
  pbVar1[5] = 0;
  pbVar1[6] = 0;
  pbVar1[7] = 0;
  (this->items_).size_ = sVar2 + 1;
  PlainString<4224UL>::operator+=(&this->data_,str);
  (this->data_).data_[(this->data_).size_] = '\0';
  sVar2 = (this->data_).size_;
  (this->data_).size_ = sVar2 + 1;
  (this->data_).data_[sVar2 + 1] = '\0';
  return;
}

Assistant:

void add(const std::string &str) {
        items_.pop_back();
        items_.push_back(data_.c_str() + data_.size());
        items_.push_back(nullptr);
        data_ += str;
        data_ += '\0';
    }